

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

int * Fraig_ManSaveCounterExample(Fraig_Man_t *p,Fraig_Node_t *pNode)

{
  uint fCompl_00;
  int iVar1;
  int local_30;
  int fCompl;
  int i;
  int iPattern;
  int *pModel;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *p_local;
  
  fCompl_00 = (uint)((((ulong)pNode & 1) != 0 ^ 0xffU) & 1);
  p_local = (Fraig_Man_t *)Fraig_ManAllocCounterExample(p);
  iVar1 = Fraig_FindFirstDiff(p->pConst1,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe),
                              fCompl_00,p->nWordsRand,1);
  if (iVar1 < 0) {
    iVar1 = Fraig_FindFirstDiff(p->pConst1,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe),
                                fCompl_00,p->iWordStart,0);
    if (iVar1 < 0) {
      if (p_local != (Fraig_Man_t *)0x0) {
        free(p_local);
      }
      p_local = (Fraig_Man_t *)0x0;
    }
    else {
      for (local_30 = 0; local_30 < p->vInputs->nSize; local_30 = local_30 + 1) {
        if ((p->vInputs->pArray[local_30]->puSimD[iVar1 >> 5] & 1 << ((byte)iVar1 & 0x1f)) != 0) {
          *(int *)((long)&p_local->vInputs + (long)local_30 * 4) = 1;
        }
      }
      iVar1 = Fraig_ManSimulateBitNode(p,pNode,(int *)p_local);
      if (iVar1 == 0) {
        __assert_fail("Fraig_ManSimulateBitNode( p, pNode, pModel )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,900,"int *Fraig_ManSaveCounterExample(Fraig_Man_t *, Fraig_Node_t *)");
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < p->vInputs->nSize; local_30 = local_30 + 1) {
      if ((p->vInputs->pArray[local_30]->puSimR[iVar1 >> 5] & 1 << ((byte)iVar1 & 0x1f)) != 0) {
        *(int *)((long)&p_local->vInputs + (long)local_30 * 4) = 1;
      }
    }
    iVar1 = Fraig_ManSimulateBitNode(p,pNode,(int *)p_local);
    if (iVar1 == 0) {
      __assert_fail("Fraig_ManSimulateBitNode( p, pNode, pModel )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                    ,0x375,"int *Fraig_ManSaveCounterExample(Fraig_Man_t *, Fraig_Node_t *)");
    }
  }
  return (int *)p_local;
}

Assistant:

int * Fraig_ManSaveCounterExample( Fraig_Man_t * p, Fraig_Node_t * pNode )
{
    int * pModel;
    int iPattern;
    int i, fCompl;

    // the node can be complemented
    fCompl = Fraig_IsComplement(pNode);
    // because we compare with constant 0, p->pConst1 should also be complemented
    fCompl = !fCompl;

    // derive the model
    pModel = Fraig_ManAllocCounterExample( p );
    iPattern = Fraig_FindFirstDiff( p->pConst1, Fraig_Regular(pNode), fCompl, p->nWordsRand, 1 );
    if ( iPattern >= 0 )
    {
        for ( i = 0; i < p->vInputs->nSize; i++ )
            if ( Fraig_BitStringHasBit( p->vInputs->pArray[i]->puSimR, iPattern ) )
                pModel[i] = 1;
/*
printf( "SAT solver's pattern:\n" );
for ( i = 0; i < p->vInputs->nSize; i++ )
    printf( "%d", pModel[i] );
printf( "\n" );
*/
        assert( Fraig_ManSimulateBitNode( p, pNode, pModel ) );
        return pModel;
    }
    iPattern = Fraig_FindFirstDiff( p->pConst1, Fraig_Regular(pNode), fCompl, p->iWordStart, 0 );
    if ( iPattern >= 0 )
    {
        for ( i = 0; i < p->vInputs->nSize; i++ )
            if ( Fraig_BitStringHasBit( p->vInputs->pArray[i]->puSimD, iPattern ) )
                pModel[i] = 1;
/*
printf( "SAT solver's pattern:\n" );
for ( i = 0; i < p->vInputs->nSize; i++ )
    printf( "%d", pModel[i] );
printf( "\n" );
*/
        assert( Fraig_ManSimulateBitNode( p, pNode, pModel ) );
        return pModel;
    }
    ABC_FREE( pModel );
    return NULL;
}